

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::LocalScanner::visitLocalSet(LocalScanner *this,LocalSet *curr)

{
  uint uVar1;
  pointer pLVar2;
  bool bVar3;
  Index IVar4;
  Type TVar5;
  Load *load;
  Expression *pEVar6;
  
  bVar3 = Function::isParam((this->
                            super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            ).
                            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            .currFunction,curr->index);
  if ((!bVar3) &&
     (TVar5 = Function::getLocalType
                        ((this->
                         super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                         ).
                         super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                         currFunction,curr->index), (TVar5.id & 0xfffffffffffffffe) == 2)) {
    load = (Load *)Properties::getFallthrough
                             (curr->value,this->passOptions,
                              (this->
                              super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                              ).
                              super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                              .currModule,AllowTeeBrIf);
    uVar1 = curr->index;
    pLVar2 = (this->localInfo->super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    IVar4 = Bits::getMaxBits<wasm::LocalScanner>((Expression *)load,this);
    if (IVar4 < pLVar2[uVar1].maxBits) {
      IVar4 = pLVar2[uVar1].maxBits;
    }
    pLVar2[uVar1].maxBits = IVar4;
    pEVar6 = Properties::getSignExtValue((Expression *)load);
    if (pEVar6 == (Expression *)0x0) {
      IVar4 = 0xffffffff;
      if ((((load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id ==
            LoadId) && (bVar3 = LoadUtils::isSignRelevant(load), bVar3)) && (load->signed_ == true))
      {
        IVar4 = (uint)load->bytes << 3;
      }
    }
    else {
      IVar4 = Properties::getSignExtBits((Expression *)load);
    }
    if (pLVar2[uVar1].signExtBits != 0) {
      if (pLVar2[uVar1].signExtBits == IVar4) {
        return;
      }
      IVar4 = 0xffffffff;
    }
    pLVar2[uVar1].signExtBits = IVar4;
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    auto* func = getFunction();
    if (func->isParam(curr->index)) {
      return;
    }
    auto type = getFunction()->getLocalType(curr->index);
    if (type != Type::i32 && type != Type::i64) {
      return;
    }
    // an integer var, worth processing
    auto* value =
      Properties::getFallthrough(curr->value, passOptions, *getModule());
    auto& info = localInfo[curr->index];
    info.maxBits = std::max(info.maxBits, Bits::getMaxBits(value, this));
    auto signExtBits = LocalInfo::kUnknown;
    if (Properties::getSignExtValue(value)) {
      signExtBits = Properties::getSignExtBits(value);
    } else if (auto* load = value->dynCast<Load>()) {
      if (LoadUtils::isSignRelevant(load) && load->signed_) {
        signExtBits = load->bytes * 8;
      }
    }
    if (info.signExtBits == 0) {
      info.signExtBits = signExtBits; // first info we see
    } else if (info.signExtBits != signExtBits) {
      // contradictory information, give up
      info.signExtBits = LocalInfo::kUnknown;
    }
  }